

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_system_matrix.cc
# Opt level: O3

tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
* projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow
            (tuple<lf::assemble::COOMatrix<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
             *__return_storage_ptr__,shared_ptr<const_lf::mesh::Mesh> *mesh,DofHandler *dofh,
            function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
            *f,function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_lf::mesh::Entity_&)>
               *dirichlet_data,double sigma,QuadRule *quadrule,bool modified_penalty)

{
  pointer pcVar1;
  PointerType pdVar2;
  element_type *peVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  size_type sVar7;
  pointer pTVar8;
  shared_ptr<const_lf::mesh::Mesh> *mesh_00;
  DofHandler *dof_handler_trial;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 extraout_var;
  Matrix<double,_2,_1,_0,_2,_1> *pMVar13;
  Entity *pEVar14;
  Scalar *pSVar15;
  undefined4 extraout_var_01;
  bool *pbVar16;
  undefined4 extraout_var_02;
  ostream *poVar17;
  long extraout_RDX;
  ulong uVar18;
  long lVar19;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var20;
  long lVar21;
  ulong uVar22;
  __normal_iterator<Eigen::Triplet<double,_int>_*,_std::vector<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>_>
  _Var23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  VectorXd rhs;
  COOMatrix<double> A;
  anon_class_16_2_b3f1b856 selector;
  VectorXd offset_function;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> dirichlet;
  AllCodimMeshDataSet<bool> boundary;
  PiecewiseConstElementVectorProvider elem_vec_builder;
  stringstream ss;
  PiecewiseConstElementMatrixProvider elem_mat_builder;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_438;
  COOMatrix<double> local_428;
  DofHandler *local_408;
  AllCodimMeshDataSet<bool> *local_400;
  undefined1 local_3f8 [32];
  StorageIndex *local_3d8;
  CompressedStorage<double,_int> local_3d0;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0 [2];
  undefined1 local_378 [48];
  double local_348;
  Matrix<double,__1,_1,_0,__1,_1> local_340;
  shared_ptr<const_lf::mesh::Mesh> local_330;
  QuadRule *local_320;
  function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  *local_318;
  shared_ptr<const_lf::mesh::Mesh> *local_310;
  DofHandler *local_308;
  _Any_data local_300;
  code *local_2f0;
  CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_2e0;
  QuadRule local_2a8;
  AllCodimMeshDataSet<bool> local_278;
  PiecewiseConstElementVectorProvider local_240;
  _Any_data local_1d8;
  double local_1c8;
  void *local_1c0;
  void *local_1b8;
  CompressedStorage<double,_int> local_1b0 [11];
  PiecewiseConstElementMatrixProvider local_48;
  undefined4 extraout_var_00;
  
  local_348 = sigma;
  local_320 = quadrule;
  local_318 = f;
  lf::mesh::utils::flagEntitiesOnBoundary(&local_278,mesh);
  local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::CodimMeshDataSet
            (&local_2e0,&local_330,1);
  local_308 = dofh;
  if (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar3 = (mesh->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_310 = mesh;
  iVar10 = (*peVar3->_vptr_Mesh[2])(peVar3,1);
  if (extraout_RDX != 0) {
    lVar21 = 0;
    do {
      if ((dirichlet_data->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_002b41df;
      }
      pEVar14 = *(Entity **)(CONCAT44(extraout_var,iVar10) + lVar21);
      (*dirichlet_data->_M_invoker)(&local_1d8,(Entity *)dirichlet_data);
      pMVar13 = lf::mesh::utils::CodimMeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator()
                          (&local_2e0,pEVar14);
      (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [0] = (double)local_1d8._M_unused._0_8_;
      (pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
      [1] = (double)local_1d8._8_8_;
      lVar21 = lVar21 + 8;
    } while (extraout_RDX << 3 != lVar21);
  }
  dof_handler_trial = local_308;
  uVar11 = (*local_308->_vptr_DofHandler[2])(local_308);
  local_428.cols_ = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_428.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (Triplet<double,_int> *)0x0;
  local_428.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (Triplet<double,_int> *)0x0;
  local_428.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.rows_ = uVar11;
  PiecewiseConstElementMatrixProvider::PiecewiseConstElementMatrixProvider
            (&local_48,local_348,&local_278.super_MeshDataSet<bool>,modified_penalty);
  lf::assemble::
  AssembleMatrixLocally<lf::assemble::COOMatrix<double>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider>
            (0,dof_handler_trial,dof_handler_trial,&local_48,&local_428);
  uVar11 = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  local_240.sigma_ = 0.0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)&local_1d8,(ulong)uVar11,1,(scalar_constant_op<double> *)&local_240);
  local_438.m_storage.m_data = (double *)0x0;
  local_438.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_438,local_1d8._M_unused._M_member_pointer,1);
  mesh_00 = local_310;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_438,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)&local_1d8,(assign_op<double,_double> *)&local_240);
  auVar6 = _DAT_00359090;
  auVar5 = _DAT_00359080;
  if (0 < local_438.m_storage.m_rows) {
    uVar18 = local_438.m_storage.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar24._8_4_ = (int)uVar18;
    auVar24._0_8_ = uVar18;
    auVar24._12_4_ = (int)(uVar18 >> 0x20);
    lVar21 = 0;
    auVar24 = auVar24 ^ _DAT_00359090;
    do {
      auVar25._8_4_ = (int)lVar21;
      auVar25._0_8_ = lVar21;
      auVar25._12_4_ = (int)((ulong)lVar21 >> 0x20);
      auVar25 = (auVar25 | auVar5) ^ auVar6;
      if ((bool)(~(auVar25._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar25._0_4_ ||
                  auVar24._4_4_ < auVar25._4_4_) & 1)) {
        local_438.m_storage.m_data[lVar21] = local_1c8;
      }
      if ((auVar25._12_4_ != auVar24._12_4_ || auVar25._8_4_ <= auVar24._8_4_) &&
          auVar25._12_4_ <= auVar24._12_4_) {
        local_438.m_storage.m_data[lVar21 + 1] = local_1c8;
      }
      lVar21 = lVar21 + 2;
    } while ((uVar18 - ((uint)(local_438.m_storage.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar21
            );
  }
  std::function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
  ::function((function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
              *)&local_300,local_318);
  lf::quad::QuadRule::QuadRule(&local_2a8,local_320);
  PiecewiseConstElementVectorProvider::PiecewiseConstElementVectorProvider
            (&local_240,local_348,
             (function<Eigen::Matrix<double,_2,_1,_0,_2,_1>_(const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_&)>
              *)&local_300,&local_2a8,&local_278.super_MeshDataSet<bool>,
             &local_2e0.super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>);
  free(local_2a8.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free(local_2a8.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  if (local_2f0 != (code *)0x0) {
    (*local_2f0)(&local_300,&local_300,__destroy_functor);
  }
  lf::assemble::
  AssembleVectorLocally<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider>
            (0,dof_handler_trial,&local_240,(Matrix<double,__1,_1,_0,__1,_1> *)&local_438);
  lf::assemble::COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)&local_1d8,&local_428)
  ;
  createOffsetFunction
            ((assemble *)&local_340,mesh_00,&local_278.super_MeshDataSet<bool>,dof_handler_trial,
             dirichlet_data,(SparseMatrix<double,_0,_int> *)&local_1d8);
  free(local_1c0);
  free(local_1b8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(local_1b0);
  lf::assemble::COOMatrix<double>::makeSparse((SparseMatrix<double,_0,_int> *)local_3f8,&local_428);
  uVar11 = (*dof_handler_trial->_vptr_DofHandler[2])(dof_handler_trial);
  peVar3 = (mesh_00->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar12 = (*peVar3->_vptr_Mesh[3])(peVar3,2);
  Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_-1,_-1,_false>::Block
            ((Block<Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false> *)local_378,
             (SparseMatrix<double,_0,_int> *)local_3f8,0,0,(ulong)uVar11,(ulong)uVar12);
  peVar3 = (mesh_00->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar11 = (*peVar3->_vptr_Mesh[3])(peVar3,2);
  Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>::Block
            ((Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)local_3b0,
             &local_340,0,0,(ulong)uVar11,1);
  Eigen::
  Product<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,_-1,_-1,_false>,_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
  ::Product((Product<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
             *)&local_1d8,(Lhs *)local_378,(Rhs *)local_3b0);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Block<Eigen::SparseMatrix<double,0,int>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>,0>,Eigen::internal::sub_assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_438,
             (Product<Eigen::Block<Eigen::SparseMatrix<double,_0,_int>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
              *)&local_1d8,(sub_assign_op<double,_double> *)&local_408,(type)0x0);
  free((void *)CONCAT26(local_3f8._30_2_,CONCAT15(local_3f8[0x1d],local_3f8._24_5_)));
  free(local_3d8);
  Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_3d0);
  sVar7 = local_428.cols_;
  local_408 = dof_handler_trial;
  uVar18 = (ulong)local_428.cols_;
  local_400 = &local_278;
  if (local_428.rows_ != local_428.cols_) {
LAB_002b41df:
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c8,"Matrix must be square!",0x16);
    pcVar1 = local_3f8 + 0x10;
    local_3f8._16_4_ = 0x6f722e41;
    local_3f8[0x14] = 'w';
    local_3f8[0x15] = 's';
    local_3f8._22_2_ = 0x2928;
    local_3f8._24_5_ = 0x4e203d3d20;
    local_3f8._8_8_ = 0xd;
    local_3f8[0x1d] = '\0';
    pdVar2 = (PointerType)(local_3b0 + 0x10);
    local_3f8._0_8_ = pcVar1;
    local_3b0._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_3f8,(string *)local_3b0,0x5a,(string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
    }
    if ((PointerType)local_3b0._0_8_ != pdVar2) {
      operator_delete((void *)local_3b0._0_8_,local_3a0[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,
                      CONCAT26(local_3f8._22_2_,
                               CONCAT15(local_3f8[0x15],CONCAT14(local_3f8[0x14],local_3f8._16_4_)))
                      + 1);
    }
    local_3f8._16_4_ = 0x736c6166;
    local_3f8[0x14] = 'e';
    local_3f8[0x15] = '\0';
    local_3f8._8_8_ = 5;
    local_3f8._0_8_ = pcVar1;
    local_3b0._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_378._8_8_ = (non_const_type)0x0;
    local_378[0x10] = '\0';
    local_378._0_8_ = local_378 + 0x10;
    lf::base::AssertionFailed((string *)local_3f8,(string *)local_3b0,0x5a,(string *)local_378);
LAB_002b4350:
    std::__cxx11::string::~string((string *)local_378);
    std::__cxx11::string::~string((string *)local_3b0);
    std::__cxx11::string::~string((string *)local_3f8);
    abort();
  }
  if (local_438.m_storage.m_rows != uVar18) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c8,"Mismatch N = ",0xd);
    poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17," <-> b.size() = ",0x10);
    std::ostream::_M_insert<long>((long)poVar17);
    pcVar1 = local_3f8 + 0x10;
    local_3f8._16_4_ = 0x3d3d204e;
    local_3f8[0x14] = ' ';
    local_3f8[0x15] = 'b';
    local_3f8._22_2_ = 0x732e;
    local_3f8._24_5_ = 0x2928657a69;
    local_3f8._8_8_ = 0xd;
    local_3f8[0x1d] = '\0';
    pdVar2 = (PointerType)(local_3b0 + 0x10);
    local_3f8._0_8_ = pcVar1;
    local_3b0._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    std::__cxx11::stringbuf::str();
    lf::base::AssertionFailed((string *)local_3f8,(string *)local_3b0,0x5c,(string *)local_378);
    if ((undefined1 *)local_378._0_8_ != local_378 + 0x10) {
      operator_delete((void *)local_378._0_8_,CONCAT71(local_378._17_7_,local_378[0x10]) + 1);
    }
    if ((PointerType)local_3b0._0_8_ != pdVar2) {
      operator_delete((void *)local_3b0._0_8_,local_3a0[0]._M_allocated_capacity + 1);
    }
    if ((pointer)local_3f8._0_8_ != pcVar1) {
      operator_delete((void *)local_3f8._0_8_,
                      CONCAT26(local_3f8._22_2_,
                               CONCAT15(local_3f8[0x15],CONCAT14(local_3f8[0x14],local_3f8._16_4_)))
                      + 1);
    }
    local_3f8._16_4_ = 0x736c6166;
    local_3f8[0x14] = 'e';
    local_3f8[0x15] = '\0';
    local_3f8._8_8_ = 5;
    local_3f8._0_8_ = pcVar1;
    local_3b0._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/fix_dof.h"
               ,"");
    local_378._8_8_ = (non_const_type)0x0;
    local_378[0x10] = '\0';
    local_378._0_8_ = local_378 + 0x10;
    lf::base::AssertionFailed((string *)local_3f8,(string *)local_3b0,0x5c,(string *)local_378);
    goto LAB_002b4350;
  }
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1d8,uVar18);
  if (uVar18 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_408->_vptr_DofHandler[7])(local_408,uVar22);
      pEVar14 = (Entity *)CONCAT44(extraout_var_00,iVar10);
      iVar10 = (*pEVar14->_vptr_Entity[4])(pEVar14);
      if ((char)iVar10 == '\x01') {
        lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_400,pEVar14);
      }
      pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           local_1d8._M_pod_data,uVar22);
      *pSVar15 = 0.0;
      uVar22 = uVar22 + 1;
    } while (uVar18 != uVar22);
  }
  lf::assemble::COOMatrix<double>::
  MatVecMult<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
            (&local_428,-1.0,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1d8,
             (Matrix<double,__1,_1,_0,__1,_1> *)&local_438);
  free(local_1d8._M_unused._M_object);
  if (sVar7 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_408->_vptr_DofHandler[7])(local_408,uVar22);
      pEVar14 = (Entity *)CONCAT44(extraout_var_01,iVar10);
      iVar10 = (*pEVar14->_vptr_Entity[4])(pEVar14);
      if (((char)iVar10 == '\x01') &&
         (pbVar16 = lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_400,pEVar14),
         *pbVar16 == true)) {
        pSVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &local_438,uVar22);
        *pSVar15 = 0.0;
      }
      uVar22 = uVar22 + 1;
    } while (uVar18 != uVar22);
  }
  pTVar8 = local_428.triplets_.
           super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar21 = (long)local_428.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_428.triplets_.
                 super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  _Var20._M_current =
       local_428.triplets_.
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_3f8._0_8_ = (sub_assign_op<double,_double> *)&local_408;
  local_1d8._M_unused._0_8_ = (undefined8)(sub_assign_op<double,_double> *)&local_408;
  if (0 < lVar21 >> 6) {
    lVar19 = (lVar21 >> 6) + 1;
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1d8._M_pod_data,_Var20);
      _Var23._M_current = _Var20._M_current;
      if (bVar9) goto LAB_002b404a;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1d8._M_pod_data,_Var20._M_current + 1);
      _Var23._M_current = _Var20._M_current + 1;
      if (bVar9) goto LAB_002b404a;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1d8._M_pod_data,_Var20._M_current + 2);
      _Var23._M_current = _Var20._M_current + 2;
      if (bVar9) goto LAB_002b404a;
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_1d8._M_pod_data,_Var20._M_current + 3);
      _Var23._M_current = _Var20._M_current + 3;
      if (bVar9) goto LAB_002b404a;
      _Var20._M_current = _Var20._M_current + 4;
      lVar19 = lVar19 + -1;
      lVar21 = lVar21 + -0x40;
    } while (1 < lVar19);
  }
  lVar21 = lVar21 >> 4;
  if (lVar21 == 1) {
LAB_002b4031:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1d8._M_pod_data,_Var20);
    _Var23._M_current = _Var20._M_current;
    if (!bVar9) {
      _Var23._M_current = pTVar8;
    }
  }
  else if (lVar21 == 2) {
LAB_002b400e:
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1d8._M_pod_data,_Var20);
    _Var23._M_current = _Var20._M_current;
    if (!bVar9) {
      _Var20._M_current = _Var20._M_current + 1;
      goto LAB_002b4031;
    }
  }
  else {
    _Var23._M_current = pTVar8;
    if (lVar21 != 3) goto LAB_002b4091;
    bVar9 = __gnu_cxx::__ops::
            _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
            ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                          *)local_1d8._M_pod_data,_Var20);
    _Var23._M_current = _Var20._M_current;
    if (!bVar9) {
      _Var20._M_current = _Var20._M_current + 1;
      goto LAB_002b400e;
    }
  }
LAB_002b404a:
  _Var20._M_current = _Var23._M_current + 1;
  if (_Var20._M_current != pTVar8 && _Var23._M_current != pTVar8) {
    do {
      bVar9 = __gnu_cxx::__ops::
              _Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,Eigen::Matrix<double,-1,1,0,-1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::$_0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,-1,1,0,-1,1>&)::{lambda(long,long)#1}&&)::{lambda(Eigen::Triplet<double,int>&)#1}>
              ::operator()((_Iter_pred<lf::assemble::COOMatrix<double>::setZero<lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_>(lf::assemble::FixFlaggedSolutionComponents<double,projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,Eigen::Matrix<double,_1,1,0,_1,1>>(projects::ipdg_stokes::assemble::buildSystemMatrixInOutFlow(std::shared_ptr<lf::mesh::Mesh_const>const&,lf::assemble::DofHandler_const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(Eigen::Matrix<double,2,1,0,2,1>const&)>const&,std::function<Eigen::Matrix<double,2,1,0,2,1>(lf::mesh::Entity_const&)>const&,double,lf::quad::QuadRule_const&,bool)::__0&,lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&)::_lambda(long,long)_1_&&)::_lambda(Eigen::Triplet<double,int>&)_1_>
                            *)local_3f8,_Var20);
      if (!bVar9) {
        iVar10 = (_Var20._M_current)->m_col;
        dVar4 = (_Var20._M_current)->m_value;
        (_Var23._M_current)->m_row = (_Var20._M_current)->m_row;
        (_Var23._M_current)->m_col = iVar10;
        (_Var23._M_current)->m_value = dVar4;
        _Var23._M_current = _Var23._M_current + 1;
      }
      _Var20._M_current = _Var20._M_current + 1;
    } while (_Var20._M_current != pTVar8);
  }
LAB_002b4091:
  if (_Var23._M_current !=
      local_428.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_428.triplets_.
    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = _Var23._M_current;
  }
  if (sVar7 != 0) {
    uVar22 = 0;
    do {
      iVar10 = (*local_408->_vptr_DofHandler[7])(local_408,uVar22);
      pEVar14 = (Entity *)CONCAT44(extraout_var_02,iVar10);
      iVar10 = (*pEVar14->_vptr_Entity[4])(pEVar14);
      if (((char)iVar10 == '\x01') &&
         (pbVar16 = lf::mesh::utils::AllCodimMeshDataSet<bool>::operator()(local_400,pEVar14),
         *pbVar16 == true)) {
        lf::assemble::COOMatrix<double>::AddToEntry(&local_428,uVar22,uVar22,1.0);
      }
      uVar22 = uVar22 + 1;
    } while (uVar18 != uVar22);
  }
  std::
  _Tuple_impl<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>>
  ::
  _Tuple_impl<lf::assemble::COOMatrix<double>&,Eigen::Matrix<double,_1,1,0,_1,1>&,Eigen::Matrix<double,_1,1,0,_1,1>const&,void>
            ((_Tuple_impl<0ul,lf::assemble::COOMatrix<double>,Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              *)__return_storage_ptr__,&local_428,(Matrix<double,__1,_1,_0,__1,_1> *)&local_438,
             &local_340);
  free(local_340.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_240.quadrule_.weights_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
       m_storage.m_data);
  free(local_240.quadrule_.points_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
       m_storage.m_data);
  if (local_240.f_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_240.f_.super__Function_base._M_manager)
              ((_Any_data *)&local_240.f_,(_Any_data *)&local_240.f_,__destroy_functor);
  }
  free(local_438.m_storage.m_data);
  if (local_428.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (Triplet<double,_int> *)0x0) {
    operator_delete(local_428.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_2e0.super_MeshDataSet<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>._vptr_MeshDataSet =
       (_func_int **)&PTR_operator___003ed8d8;
  if (local_2e0.data_.m_holder.m_capacity != 0) {
    operator_delete(local_2e0.data_.m_holder.m_start,local_2e0.data_.m_holder.m_capacity << 4);
  }
  if (local_2e0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2e0.mesh_.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  lf::mesh::utils::AllCodimMeshDataSet<bool>::~AllCodimMeshDataSet(&local_278);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<lf::assemble::COOMatrix<double>, Eigen::VectorXd, Eigen::VectorXd>
buildSystemMatrixInOutFlow(
    const std::shared_ptr<const lf::mesh::Mesh> &mesh,
    const lf::assemble::DofHandler &dofh,
    const std::function<Eigen::Vector2d(const Eigen::Vector2d &)> &f,
    const std::function<Eigen::Vector2d(const lf::mesh::Entity &)>
        &dirichlet_data,
    double sigma, const lf::quad::QuadRule &quadrule, bool modified_penalty) {
  // Compute the boundary elements
  const auto boundary = lf::mesh::utils::flagEntitiesOnBoundary(mesh);
  // Compute the dirichlet data
  auto dirichlet = lf::mesh::utils::CodimMeshDataSet<Eigen::Vector2d>(mesh, 1);
  for (const auto *ep : mesh->Entities(1)) {
    dirichlet(*ep) = dirichlet_data(*ep);
  }
  // Assemble the system matrix
  lf::assemble::COOMatrix<double> A(dofh.NumDofs(), dofh.NumDofs());
  const auto elem_mat_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementMatrixProvider(
          sigma, boundary, modified_penalty);
  lf::assemble::AssembleMatrixLocally(0, dofh, dofh, elem_mat_builder, A);
  // Assemble the right hand side
  Eigen::VectorXd rhs = Eigen::VectorXd::Zero(dofh.NumDofs());
  const auto elem_vec_builder =
      projects::ipdg_stokes::assemble::PiecewiseConstElementVectorProvider(
          sigma, f, quadrule, boundary, dirichlet);
  lf::assemble::AssembleVectorLocally(0, dofh, elem_vec_builder, rhs);

  // Compute the offset function
  const Eigen::VectorXd offset_function = createOffsetFunction(
      mesh, boundary, dofh, dirichlet_data, A.makeSparse());

  // Apply offset function technique to the LSE
  rhs -= A.makeSparse().block(0, 0, dofh.NumDofs(), mesh->NumEntities(2)) *
         offset_function.head(mesh->NumEntities(2));
  auto selector = [&](lf::base::size_type idx) -> std::pair<bool, double> {
    const auto &e = dofh.Entity(idx);
    return {e.RefEl() == lf::base::RefElType::kPoint && boundary(e), 0};
  };
  lf::assemble::FixFlaggedSolutionComponents(selector, A, rhs);

  // Return the computed LSE
  return {A, rhs, offset_function};
}